

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

opj_bool dwt_decode_v2(opj_tcd_tilecomp_v2_t *tilec,OPJ_UINT32 numres)

{
  int iVar1;
  int iVar2;
  opj_bool oVar3;
  OPJ_INT32 *pOVar4;
  int *__src;
  long lVar5;
  int iVar6;
  int x;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  opj_tcd_resolution_v2_t *poVar15;
  dwt_t v;
  dwt_t h;
  uint local_cc;
  uint local_c4;
  dwt_t local_60;
  dwt_t local_48;
  
  poVar15 = tilec->resolutions;
  uVar10 = 0;
  iVar14 = numres - 1;
  if (iVar14 != 0) {
    pOVar4 = &poVar15[1].y1;
    iVar6 = iVar14;
    do {
      uVar8 = pOVar4[-1] - ((opj_tcd_resolution_v2_t *)(pOVar4 + -3))->x0;
      if (uVar8 < (uint)uVar10) {
        uVar8 = (uint)uVar10;
      }
      uVar12 = *pOVar4 - pOVar4[-2];
      if ((uint)(*pOVar4 - pOVar4[-2]) < uVar8) {
        uVar12 = uVar8;
      }
      uVar10 = (ulong)uVar12;
      pOVar4 = pOVar4 + 0x2c;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    uVar10 = (ulong)uVar12 << 2;
  }
  iVar6 = poVar15->x1;
  iVar13 = poVar15->x0;
  iVar1 = poVar15->y0;
  iVar2 = poVar15->y1;
  x = tilec->x1 - tilec->x0;
  __src = (int *)malloc(uVar10);
  if (__src == (int *)0x0) {
    oVar3 = 0;
  }
  else {
    local_60.mem = __src;
    local_48.mem = __src;
    if (iVar14 != 0) {
      local_cc = iVar2 - iVar1;
      local_c4 = iVar6 - iVar13;
      do {
        pOVar4 = tilec->data;
        local_48.sn = local_c4;
        local_60.sn = local_cc;
        iVar6 = poVar15[1].y0;
        uVar8 = poVar15[1].x1 - poVar15[1].x0;
        iVar13 = uVar8 - local_c4;
        local_48.cas = poVar15[1].x0 % 2;
        uVar12 = poVar15[1].y1 - iVar6;
        local_48.dn = iVar13;
        if (uVar12 != 0) {
          lVar5 = (long)local_48.cas;
          uVar10 = 0;
          uVar11 = 0;
          do {
            if (local_c4 != 0) {
              lVar9 = 0;
              do {
                __src[lVar5 + lVar9 * 2] = pOVar4[uVar10 + lVar9];
                lVar9 = lVar9 + 1;
              } while (local_c4 != (uint)lVar9);
            }
            if (iVar13 != 0) {
              lVar9 = 0;
              do {
                __src[(lVar9 * 2 + 1) - lVar5] = pOVar4[(long)(int)local_c4 + uVar10 + lVar9];
                lVar9 = lVar9 + 1;
              } while (iVar13 != (int)lVar9);
            }
            dwt_decode_1(&local_48);
            memcpy(pOVar4 + (uint)(x * (int)uVar11),__src,(ulong)uVar8 * 4);
            uVar11 = uVar11 + 1;
            uVar10 = (ulong)(uint)((int)uVar10 + x);
          } while (uVar11 != uVar12);
          iVar6 = poVar15[1].y0;
        }
        local_60.dn = uVar12 - local_cc;
        local_60.cas = iVar6 % 2;
        if (uVar8 != 0) {
          uVar10 = 0;
          do {
            dwt_interleave_v(&local_60,pOVar4 + uVar10,x);
            dwt_decode_1(&local_60);
            if (uVar12 != 0) {
              uVar11 = uVar10 & 0xffffffff;
              uVar7 = 0;
              do {
                pOVar4[uVar11] = __src[uVar7];
                uVar7 = uVar7 + 1;
                uVar11 = (ulong)(uint)((int)uVar11 + x);
              } while (uVar12 != uVar7);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar8);
        }
        poVar15 = poVar15 + 1;
        iVar14 = iVar14 + -1;
        local_cc = uVar12;
        local_c4 = uVar8;
      } while (iVar14 != 0);
    }
    free(__src);
    oVar3 = 1;
  }
  return oVar3;
}

Assistant:

opj_bool dwt_decode_v2(opj_tcd_tilecomp_v2_t* tilec, OPJ_UINT32 numres) {
	return dwt_decode_tile_v2(tilec, numres, &dwt_decode_1);
}